

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

int Acb_NtkFindSupp1(Acb_Ntk_t *p,int Pivot,sat_solver *pSat,int nVars,int nDivs,Vec_Int_t *vWin,
                    Vec_Int_t *vSupp)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int fCompl;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  
  vSupp->nSize = 0;
  piVar4 = Acb_ObjFanins(p,Pivot);
  for (lVar9 = 0; lVar9 < *piVar4; lVar9 = lVar9 + 1) {
    Vec_IntPush(vSupp,piVar4[lVar9 + 1]);
  }
  uVar1 = vSupp->nSize;
  uVar6 = 1;
  if (1 < (int)uVar1) {
    uVar6 = uVar1;
  }
  piVar4 = vSupp->pArray;
  uVar5 = 1;
  for (uVar8 = 0; uVar8 != uVar6 - 1; uVar8 = uVar8 + 1) {
    uVar11 = uVar8 & 0xffffffff;
    uVar12 = uVar5;
    while( true ) {
      uVar10 = (uint)uVar11;
      if (uVar1 == uVar12) break;
      iVar2 = Acb_ObjFanoutNum(p,piVar4[uVar12]);
      iVar3 = Acb_ObjFanoutNum(p,piVar4[(int)uVar10]);
      uVar7 = (uint)uVar12;
      if (iVar2 <= iVar3) {
        uVar7 = uVar10;
      }
      uVar12 = uVar12 + 1;
      uVar11 = (ulong)uVar7;
    }
    iVar2 = piVar4[uVar8];
    piVar4[uVar8] = piVar4[(int)uVar10];
    piVar4[(int)uVar10] = iVar2;
    uVar5 = uVar5 + 1;
  }
  Acb_NtkRemapIntoSatVariables(p,vSupp);
  Vec_IntVars2Lits(vSupp,nVars * 2,fCompl);
  iVar2 = sat_solver_solve(pSat,vSupp->pArray,vSupp->pArray + vSupp->nSize,0,0,0,0);
  if (iVar2 == -1) {
    iVar2 = sat_solver_minimize_assumptions(pSat,vSupp->pArray,vSupp->nSize,0);
    Vec_IntShrink(vSupp,iVar2);
    Vec_IntLits2Vars(vSupp,nVars * -2);
    iVar2 = vSupp->nSize;
    iVar3 = Acb_ObjFaninNum(p,Pivot);
    return (int)(iVar2 < iVar3);
  }
  printf("Failed internal check at node %d.\n",(ulong)(uint)Pivot);
  __assert_fail("status == l_False",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                ,0x39e,
                "int Acb_NtkFindSupp1(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

int Acb_NtkFindSupp1( Acb_Ntk_t * p, int Pivot, sat_solver * pSat, int nVars, int nDivs, Vec_Int_t * vWin, Vec_Int_t * vSupp )
{
    int nSuppNew, status, k, iFanin, * pFanins;
    Vec_IntClear( vSupp );
    Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
        Vec_IntPush( vSupp, iFanin );
    Acb_NtkOrderByRefCount( p, vSupp );
    Acb_NtkRemapIntoSatVariables( p, vSupp );
    Vec_IntVars2Lits( vSupp, 2*nVars, 0 );
    status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
    if ( status != l_False )
        printf( "Failed internal check at node %d.\n", Pivot );
    assert( status == l_False );
    nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
    Vec_IntShrink( vSupp, nSuppNew );
    Vec_IntLits2Vars( vSupp, -2*nVars );
    return Vec_IntSize(vSupp) < Acb_ObjFaninNum(p, Pivot);
}